

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O1

Error __thiscall asmjit::Logger::logBinary(Logger *this,void *data,size_t size)

{
  byte bVar1;
  long lVar2;
  Error EVar3;
  ulong uVar4;
  long lVar5;
  char buffer [128];
  undefined4 local_b8;
  undefined2 local_b4;
  char acStack_b2 [130];
  
  local_b4 = 0x2061;
  local_b8 = 0x7461642e;
  do {
    if (size == 0) {
      return 0;
    }
    uVar4 = 0x10;
    if (size < 0x10) {
      uVar4 = size;
    }
    lVar2 = 0;
    do {
      lVar5 = lVar2;
      bVar1 = *data;
      acStack_b2[lVar5] = "0123456789ABCDEF"[bVar1 >> 4];
      acStack_b2[lVar5 + 1] = "0123456789ABCDEF"[bVar1 & 0xf];
      data = (void *)((long)data + 1);
      lVar2 = lVar5 + 2;
    } while ((int)uVar4 * 2 != (int)(lVar5 + 2));
    size = size - uVar4;
    acStack_b2[lVar5 + 2] = '\n';
    EVar3 = (*this->_vptr_Logger[2])(this,&local_b8,lVar5 + 9);
  } while (EVar3 == 0);
  return EVar3;
}

Assistant:

Error Logger::logBinary(const void* data, size_t size) noexcept {
  static const char prefix[] = ".data ";
  static const char hex[16] = { '0', '1', '2', '3', '4', '5', '6', '7', '8', '9', 'A', 'B', 'C', 'D', 'E', 'F' };

  const uint8_t* s = static_cast<const uint8_t*>(data);
  size_t i = size;

  char buffer[128];
  ::memcpy(buffer, prefix, ASMJIT_ARRAY_SIZE(prefix) - 1);

  while (i) {
    uint32_t n = static_cast<uint32_t>(std::min<size_t>(i, 16));
    char* p = buffer + ASMJIT_ARRAY_SIZE(prefix) - 1;

    i -= n;
    do {
      uint32_t c = s[0];

      p[0] = hex[c >> 4];
      p[1] = hex[c & 15];

      p += 2;
      s += 1;
    } while (--n);

    *p++ = '\n';
    ASMJIT_PROPAGATE(log(buffer, (size_t)(p - buffer)));
  }

  return kErrorOk;
}